

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

Vec_Wrd_t * Abc_SuppDiffMatrix(Vec_Wrd_t *vCubes)

{
  ulong *puVar1;
  int iVar2;
  ulong *puVar3;
  word *pwVar4;
  abctime aVar5;
  Vec_Wrd_t *pVec;
  Vec_Wrd_t *pVVar6;
  abctime aVar7;
  word *pwVar8;
  abctime time;
  ulong *puVar9;
  ulong *puVar10;
  
  aVar5 = Abc_Clock();
  puVar3 = vCubes->pArray;
  iVar2 = vCubes->nSize;
  puVar1 = puVar3 + iVar2;
  pVec = Vec_WrdAlloc(((iVar2 + -1) * iVar2) / 2);
  pwVar4 = pVec->pArray;
  pwVar8 = pwVar4;
  while (puVar10 = puVar3, puVar10 < puVar1) {
    for (puVar9 = puVar10 + 1; puVar3 = puVar10 + 1, puVar9 < puVar1; puVar9 = puVar9 + 1) {
      *pwVar8 = *puVar9 ^ *puVar10;
      pwVar8 = pwVar8 + 1;
    }
  }
  iVar2 = pVec->nCap;
  pVec->nSize = iVar2;
  if (pwVar8 != pwVar4 + iVar2) {
    __assert_fail("pStore == Vec_WrdLimit(vPairs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilSupp.c"
                  ,0x176,"Vec_Wrd_t *Abc_SuppDiffMatrix(Vec_Wrd_t *)");
  }
  pVVar6 = Vec_WrdDup(pVec);
  printf("Successfully generated diff matrix with %10d rows (%6.2f %%).  ",
         ((double)pVVar6->nSize * 100.0) / (double)iVar2);
  aVar7 = Abc_Clock();
  Abc_PrintTime(0x816bba,(char *)(aVar7 - aVar5),time);
  Vec_WrdFree(pVec);
  return pVVar6;
}

Assistant:

Vec_Wrd_t * Abc_SuppDiffMatrix( Vec_Wrd_t * vCubes )
{
    abctime clk = Abc_Clock();
    word * pEnt2, * pEnt = Vec_WrdArray( vCubes );
    word * pLimit = Vec_WrdLimit( vCubes );
    Vec_Wrd_t * vRes, * vPairs = Vec_WrdAlloc( Vec_WrdSize(vCubes) * (Vec_WrdSize(vCubes) - 1) / 2 );
    word * pStore = Vec_WrdArray( vPairs );
    for ( ; pEnt < pLimit; pEnt++ )
    for ( pEnt2 = pEnt+1; pEnt2 < pLimit; pEnt2++ )
        *pStore++ = *pEnt ^ *pEnt2;
    vPairs->nSize = Vec_WrdCap(vPairs);
    assert( pStore == Vec_WrdLimit(vPairs) );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    vRes = Vec_WrdUniqifyHash( vPairs, 1 );
    vRes = Vec_WrdDup( vPairs );
    printf( "Successfully generated diff matrix with %10d rows (%6.2f %%).  ", 
        Vec_WrdSize(vRes), 100.0 * Vec_WrdSize(vRes) / Vec_WrdSize(vPairs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_WrdFree( vPairs );
    return vRes;    
}